

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::checkMouseMove
          (QAbstractItemViewPrivate *this,QPersistentModelIndex *index)

{
  bool bVar1;
  QModelIndex *_t1;
  ulong uVar2;
  QPersistentModelIndex *in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  QStatusTipEvent tip_1;
  QString emptyString;
  QStatusTipEvent tip;
  QString statustip;
  QPersistentModelIndex *in_stack_fffffffffffffef8;
  QAbstractItemView *in_stack_ffffffffffffff00;
  QAbstractItemModel *pQVar3;
  QStatusTipEvent local_d8 [8];
  QPersistentModelIndex *in_stack_ffffffffffffff30;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff38;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  QStatusTipEvent local_98 [40];
  QPersistentModelIndex local_70 [3];
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QPersistentModelIndex local_40 [3];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = (QModelIndex *)q_func(in_RDI);
  setHoverIndex(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (((in_RDI->viewportEnteredNeeded & 1U) != 0) ||
     (bVar1 = ::operator!=((QPersistentModelIndex *)in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8), bVar1)) {
    in_RDI->viewportEnteredNeeded = false;
    uVar2 = QPersistentModelIndex::isValid();
    if ((uVar2 & 1) == 0) {
      if ((*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x10 != 0) &&
         ((in_RDI->shouldClearStatusTip & 1U) != 0)) {
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x7ff6e6);
        memset(local_d8,0xaa,0x28);
        QStatusTipEvent::QStatusTipEvent(local_d8,(QString *)&local_b0);
        QCoreApplication::sendEvent
                  (*(QObject **)
                    &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x10,(QEvent *)local_d8);
        QStatusTipEvent::~QStatusTipEvent(local_d8);
        QString::~QString((QString *)0x7ff730);
      }
      QAbstractItemView::viewportEntered((QAbstractItemView *)0x7ff73a);
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_40);
      QAbstractItemView::entered(in_stack_ffffffffffffff00,_t1);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = in_RDI->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
      (**(code **)(*(long *)pQVar3 + 0x90))(&local_28,pQVar3,local_70,4);
      ::QVariant::toString();
      ::QVariant::~QVariant(&local_28);
      if ((*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x10 != 0) &&
         (((in_RDI->shouldClearStatusTip & 1U) != 0 ||
          (bVar1 = QString::isEmpty((QString *)0x7ff621), !bVar1)))) {
        memset(local_98,0xaa,0x28);
        QStatusTipEvent::QStatusTipEvent(local_98,(QString *)&local_58);
        QCoreApplication::sendEvent
                  (*(QObject **)
                    &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                     super_QWidgetPrivate.field_0x10,(QEvent *)local_98);
        bVar1 = QString::isEmpty((QString *)0x7ff66b);
        in_RDI->shouldClearStatusTip = (bool)((bVar1 ^ 0xffU) & 1);
        QStatusTipEvent::~QStatusTipEvent(local_98);
      }
      QString::~QString((QString *)0x7ff695);
    }
    QPersistentModelIndex::operator=(&in_RDI->enteredIndex,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::checkMouseMove(const QPersistentModelIndex &index)
{
    //we take a persistent model index because the model might change by emitting signals
    Q_Q(QAbstractItemView);
    setHoverIndex(index);
    if (viewportEnteredNeeded || enteredIndex != index) {
        viewportEnteredNeeded = false;

        if (index.isValid()) {
            emit q->entered(index);
#if QT_CONFIG(statustip)
            QString statustip = model->data(index, Qt::StatusTipRole).toString();
            if (parent && (shouldClearStatusTip || !statustip.isEmpty())) {
                QStatusTipEvent tip(statustip);
                QCoreApplication::sendEvent(parent, &tip);
                shouldClearStatusTip = !statustip.isEmpty();
            }
#endif
        } else {
#if QT_CONFIG(statustip)
            if (parent && shouldClearStatusTip) {
                QString emptyString;
                QStatusTipEvent tip( emptyString );
                QCoreApplication::sendEvent(parent, &tip);
            }
#endif
            emit q->viewportEntered();
        }
        enteredIndex = index;
    }
}